

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<8,_457>::Type
          (Type<8,_457> *this,int zaid,double awr,int lis,int liso,AverageDecayEnergies *energies,
          DecayModes *modes,
          vector<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum>_>
          *spectra)

{
  double dVar1;
  pointer pdVar2;
  pointer pDVar3;
  
  BaseWithoutMT<njoy::ENDFtk::section::Type<8,_457>_>::BaseWithoutMT
            (&this->super_BaseWithoutMT<njoy::ENDFtk::section::Type<8,_457>_>,zaid,awr);
  this->lis_ = lis;
  this->liso_ = liso;
  this->nst_ = *(int *)&(modes->super_ListRecord).metadata.fields.
                        super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<2UL,_long,_long,_long,_long>.
                        super__Tuple_impl<3UL,_long,_long,_long> == 0;
  *(undefined8 *)
   &(this->energies_).super_ListRecord.metadata.fields.
    super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long> =
       *(undefined8 *)
        &(energies->super_ListRecord).metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>;
  ((_Head_base<4UL,_long,_false> *)
  ((long)&(this->energies_).super_ListRecord.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long> + 8))->_M_head_impl =
       ((_Head_base<4UL,_long,_false> *)
       ((long)&(energies->super_ListRecord).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long> + 8))->_M_head_impl;
  ((_Head_base<3UL,_long,_false> *)
  ((long)&(this->energies_).super_ListRecord.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long> + 0x10))->_M_head_impl =
       ((_Head_base<3UL,_long,_false> *)
       ((long)&(energies->super_ListRecord).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long> + 0x10))->_M_head_impl;
  dVar1 = (energies->super_ListRecord).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Head_base<1UL,_double,_false>._M_head_impl;
  ((_Head_base<2UL,_long,_false> *)
  ((long)&(this->energies_).super_ListRecord.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long> + 0x18))->_M_head_impl =
       (energies->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  (this->energies_).super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = dVar1;
  (this->energies_).super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       (energies->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  pdVar2 = (energies->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->energies_).super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (energies->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl
       .super__Vector_impl_data._M_start;
  (this->energies_).super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = pdVar2;
  (this->energies_).super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (energies->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (energies->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (energies->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (energies->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   &(this->modes_).super_ListRecord.metadata.fields.
    super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long> =
       *(undefined8 *)
        &(modes->super_ListRecord).metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>;
  ((_Head_base<4UL,_long,_false> *)
  ((long)&(this->modes_).super_ListRecord.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long> + 8))->_M_head_impl =
       ((_Head_base<4UL,_long,_false> *)
       ((long)&(modes->super_ListRecord).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long> + 8))->_M_head_impl;
  ((_Head_base<3UL,_long,_false> *)
  ((long)&(this->modes_).super_ListRecord.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long> + 0x10))->_M_head_impl =
       ((_Head_base<3UL,_long,_false> *)
       ((long)&(modes->super_ListRecord).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long> + 0x10))->_M_head_impl;
  dVar1 = (modes->super_ListRecord).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Head_base<1UL,_double,_false>._M_head_impl;
  ((_Head_base<2UL,_long,_false> *)
  ((long)&(this->modes_).super_ListRecord.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long> + 0x18))->_M_head_impl =
       (modes->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  (this->modes_).super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = dVar1;
  (this->modes_).super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       (modes->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  pdVar2 = (modes->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->modes_).super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (modes->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->modes_).super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdVar2;
  (this->modes_).super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (modes->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (modes->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (modes->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (modes->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pDVar3 = (spectra->
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->spectra_).
  super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (spectra->
       super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->spectra_).
  super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum>_>
  ._M_impl.super__Vector_impl_data._M_finish = pDVar3;
  (this->spectra_).
  super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (spectra->
       super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (spectra->
  super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (spectra->
  super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (spectra->
  super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

Type( int zaid, double awr, int lis, int liso,
      AverageDecayEnergies&& energies,
      DecayModes&& modes,
      std::vector< DecaySpectrum >&& spectra ) :
  BaseWithoutMT( zaid, awr ),
  lis_( lis ), liso_( liso ), nst_( modes.NDK() == 0 ),
  energies_( std::move( energies ) ),
  modes_( std::move( modes ) ),
  spectra_( std::move( spectra ) ) {}